

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

_Bool Curl_meets_timecondition(Curl_easy *data,time_t timeofdoc)

{
  undefined1 *puVar1;
  long lVar2;
  _Bool _Var3;
  char *fmt;
  
  _Var3 = true;
  if ((timeofdoc != 0) && (lVar2 = (data->set).timevalue, lVar2 != 0)) {
    if ((data->set).timecondition == CURL_TIMECOND_IFUNMODSINCE) {
      if (timeofdoc < lVar2) {
        return true;
      }
      fmt = "The requested document is not old enough\n";
    }
    else {
      if (lVar2 < timeofdoc) {
        return true;
      }
      fmt = "The requested document is not new enough\n";
    }
    _Var3 = false;
    Curl_infof(data,fmt);
    puVar1 = &(data->info).field_0xe0;
    *puVar1 = *puVar1 | 1;
  }
  return _Var3;
}

Assistant:

bool Curl_meets_timecondition(struct Curl_easy *data, time_t timeofdoc)
{
  if((timeofdoc == 0) || (data->set.timevalue == 0))
    return TRUE;

  switch(data->set.timecondition) {
  case CURL_TIMECOND_IFMODSINCE:
  default:
    if(timeofdoc <= data->set.timevalue) {
      infof(data,
            "The requested document is not new enough\n");
      data->info.timecond = TRUE;
      return FALSE;
    }
    break;
  case CURL_TIMECOND_IFUNMODSINCE:
    if(timeofdoc >= data->set.timevalue) {
      infof(data,
            "The requested document is not old enough\n");
      data->info.timecond = TRUE;
      return FALSE;
    }
    break;
  }

  return TRUE;
}